

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps_compression.cpp
# Opt level: O2

void anon_unknown.dwarf_2767::toc(char *txt)

{
  ostream *poVar1;
  double dVar2;
  
  dVar2 = timer::time_elapsed((timer *)(anonymous_namespace)::g_timer);
  std::operator<<((ostream *)&std::cout,txt);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1," seconds.\n");
  return;
}

Assistant:

void toc(const char* txt)
    {
    double ti = g_timer.time_elapsed();
    std::cout << txt << ti << " seconds.\n";
    }